

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlConvertSGMLCatalog(xmlCatalogPtr catal)

{
  int iVar1;
  int *in_RDI;
  int *local_8;
  
  iVar1 = -1;
  if ((in_RDI != (int *)0x0) && (*in_RDI == 2)) {
    local_8 = in_RDI;
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Converting SGML catalog to XML\n");
    }
    xmlHashScan(*(xmlHashTablePtr *)(local_8 + 0x18),xmlCatalogConvertEntry,&local_8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlConvertSGMLCatalog(xmlCatalogPtr catal) {

    if ((catal == NULL) || (catal->type != XML_SGML_CATALOG_TYPE))
	return(-1);

    if (xmlDebugCatalogs) {
	xmlCatalogPrintDebug(
		"Converting SGML catalog to XML\n");
    }
    xmlHashScan(catal->sgml, xmlCatalogConvertEntry, &catal);
    return(0);
}